

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpinfo.c
# Opt level: O2

char * yabmp_basename(char *path)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = strrchr(path,0x2f);
  pcVar2 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    pcVar2 = path;
  }
  return pcVar2 + (pcVar1 != (char *)0x0);
}

Assistant:

static const char* yabmp_basename(const char* path)
{
	const char* l_firstResult = NULL;
	int l_offset = 1;
	
	l_firstResult = strrchr(path, '/');
	if (l_firstResult == NULL) {
		l_firstResult = path;
		l_offset = 0;
	}
#if defined(WIN32)
	{
		const char* l_secondResult = strrchr(l_firstResult, '\\');
		if(l_secondResult != NULL) {
			l_firstResult = l_secondResult;
			l_offset = 1;
		}
	}
#endif
	return l_firstResult + l_offset;
}